

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

Llb_Mtr_t * Llb_MtrCreate(Llb_Man_t *p)

{
  int iVar1;
  int nFfs;
  int nCols;
  int nRows;
  Llb_Mtr_t *p_00;
  Llb_Grp_t *pGrp;
  int local_24;
  int i;
  Llb_Grp_t *pGroup;
  Llb_Mtr_t *pMatrix;
  Llb_Man_t *p_local;
  
  iVar1 = Saig_ManPiNum(p->pAig);
  nFfs = Saig_ManRegNum(p->pAig);
  nCols = Vec_PtrSize(p->vGroups);
  nRows = Vec_IntSize(p->vVar2Obj);
  p_00 = Llb_MtrAlloc(iVar1,nFfs,nCols,nRows);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vGroups), local_24 < iVar1; local_24 = local_24 + 1) {
    pGrp = (Llb_Grp_t *)Vec_PtrEntry(p->vGroups,local_24);
    Llb_MtrAddColumn(p_00,pGrp);
  }
  return p_00;
}

Assistant:

Llb_Mtr_t * Llb_MtrCreate( Llb_Man_t * p )
{
    Llb_Mtr_t * pMatrix;
    Llb_Grp_t * pGroup;
    int i;
    pMatrix = Llb_MtrAlloc( Saig_ManPiNum(p->pAig), Saig_ManRegNum(p->pAig), 
        Vec_PtrSize(p->vGroups), Vec_IntSize(p->vVar2Obj) );
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGroup, i )
        Llb_MtrAddColumn( pMatrix, pGroup );
//    Llb_MtrRemoveSingletonRows( pMatrix );
    return pMatrix;
}